

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nacm.c
# Opt level: O3

LY_ERR nacm_inherit_clb(lysc_node *node,void *data,ly_bool *dfs_continue)

{
  void **ppvVar1;
  lysc_ext_instance *plVar2;
  void *pvVar3;
  ly_stmt lVar4;
  LY_ERR LVar5;
  long *plVar6;
  long lVar7;
  void *pvVar8;
  lysc_ext_instance *plVar9;
  uint16_t nodetype;
  
  if (*(lysc_node **)((long)data + 8) == node) {
    return LY_SUCCESS;
  }
  nodetype = node->nodetype;
  if ((nodetype & 0x3000) != 0) {
    return LY_SUCCESS;
  }
  plVar2 = node->exts;
  if (plVar2 == (lysc_ext_instance *)0x0) {
    plVar6 = (long *)malloc(0x50);
    if (plVar6 == (long *)0x0) goto LAB_0019dbfc;
    *plVar6 = 1;
    lVar7 = 1;
  }
  else {
    pvVar3 = plVar2[-1].compiled;
    if (pvVar3 != (void *)0x0) {
      pvVar8 = pvVar3;
      plVar9 = plVar2;
      do {
        if (plVar9->def == (lysc_ext *)**data) {
          *dfs_continue = '\x01';
          return LY_SUCCESS;
        }
        plVar9 = plVar9 + 1;
        pvVar8 = (void *)((long)pvVar8 + -1);
      } while (pvVar8 != (void *)0x0);
    }
    plVar2[-1].compiled = (void *)((long)pvVar3 + 1);
    plVar6 = (long *)realloc(&plVar2[-1].compiled,(long)pvVar3 * 0x48 + 0x50);
    if (plVar6 == (long *)0x0) {
      ppvVar1 = &node->exts[-1].compiled;
      *ppvVar1 = (void *)((long)*ppvVar1 + -1);
LAB_0019dbfc:
      lyplg_ext_compile_log
                ((lysc_ctx *)0x0,*data,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "nacm_inherit_clb");
      return LY_EMEM;
    }
    lVar7 = *plVar6;
    nodetype = node->nodetype;
  }
  node->exts = (lysc_ext_instance *)(plVar6 + 1);
  plVar6 = plVar6 + lVar7 * 9;
  plVar6[-2] = 0;
  plVar6[-1] = 0;
  plVar6[-4] = 0;
  plVar6[-3] = 0;
  plVar6[-6] = 0;
  plVar6[-5] = 0;
  plVar6[-8] = 0;
  plVar6[-7] = 0;
  *plVar6 = 0;
  plVar6[-8] = **data;
  plVar6[-4] = (long)node;
  lVar4 = lyplg_ext_nodetype2stmt(nodetype);
  *(ly_stmt *)(plVar6 + -3) = lVar4;
  lVar7 = *data;
  if (*(char **)(lVar7 + 8) != (char *)0x0) {
    LVar5 = lydict_insert(node->module->ctx,*(char **)(lVar7 + 8),0,(char **)(plVar6 + -7));
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    lVar7 = *data;
  }
  *plVar6 = *(long *)(lVar7 + 0x40);
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
nacm_inherit_clb(struct lysc_node *node, void *data, ly_bool *dfs_continue)
{
    LY_ERR ret;
    struct nacm_dfs_arg *arg = data;
    struct lysc_ext_instance *inherited;
    LY_ARRAY_COUNT_TYPE u;

    /* ignore the parent from which we inherit and input/output nodes */
    if ((node != arg->parent) && !(node->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
        /* check that the node does not have its own NACM extension instance */
        LY_ARRAY_FOR(node->exts, u) {
            if (node->exts[u].def == arg->ext->def) {
                /* the child already have its own NACM flag, so skip the subtree */
                *dfs_continue = 1;
                return LY_SUCCESS;
            }
        }

        /* duplicate this one to inherit it to the child */
        LY_ARRAY_NEW_GOTO(node->module->ctx, node->exts, inherited, ret, emem);

        inherited->def = arg->ext->def;
        inherited->parent = node;
        inherited->parent_stmt = lyplg_ext_nodetype2stmt(node->nodetype);
        if (arg->ext->argument) {
            if ((ret = lydict_insert(node->module->ctx, arg->ext->argument, 0, &inherited->argument))) {
                return ret;
            }
        }
        /* copy the pointer to the static variables */
        inherited->compiled = arg->ext->compiled;
    }

    return LY_SUCCESS;

emem:
    lyplg_ext_compile_log(NULL, arg->ext, LY_LLERR, LY_EMEM, "Memory allocation failed (%s()).", __func__);
    return ret;
}